

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flag.cc
# Opt level: O3

void __thiscall
absl::lts_20240722::flags_internal::FlagImpl::CheckDefaultValueParsingRoundtrip(FlagImpl *this)

{
  char *__s;
  void *pvVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_2;
  unique_ptr<void,_absl::lts_20240722::flags_internal::DynValueDeleter> dst;
  string v;
  string local_180;
  string error;
  string local_140;
  size_type local_120;
  pointer local_118;
  AlphaNum local_f0;
  AlphaNum local_c0;
  AlphaNum local_90;
  AlphaNum local_60;
  
  DefaultValue_abi_cxx11_(&v,this);
  DataGuard(this);
  absl::lts_20240722::Mutex::Lock();
  MakeInitValue((FlagImpl *)&dst);
  error._M_string_length = 0;
  error.field_2._M_local_buf[0] = '\0';
  local_120 = v._M_string_length;
  local_118 = v._M_dataplus._M_p;
  error._M_dataplus._M_p = (pointer)&error.field_2;
  pvVar1 = (*this->op_)(kParse,&local_120,
                        dst._M_t.
                        super___uniq_ptr_impl<void,_absl::lts_20240722::flags_internal::DynValueDeleter>
                        ._M_t.
                        super__Tuple_impl<0UL,_void_*,_absl::lts_20240722::flags_internal::DynValueDeleter>
                        .super__Head_base<0UL,_void_*,_false>._M_head_impl,&error);
  if (pvVar1 != (void *)0x0) {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)error._M_dataplus._M_p != &error.field_2) {
      operator_delete(error._M_dataplus._M_p,
                      CONCAT71(error.field_2._M_allocated_capacity._1_7_,
                               error.field_2._M_local_buf[0]) + 1);
    }
    std::unique_ptr<void,_absl::lts_20240722::flags_internal::DynValueDeleter>::~unique_ptr(&dst);
    absl::lts_20240722::Mutex::Unlock();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)v._M_dataplus._M_p != &v.field_2) {
      operator_delete(v._M_dataplus._M_p,v.field_2._M_allocated_capacity + 1);
    }
    return;
  }
  local_120 = 5;
  local_118 = "Flag ";
  __s = this->name_;
  local_c0.piece_._M_len = strlen(__s);
  local_f0.piece_._M_len = 7;
  local_f0.piece_._M_str = " (from ";
  args_2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x105dae;
  local_c0.piece_._M_str = __s;
  Filename_abi_cxx11_(&local_180,this);
  local_60.piece_._M_len = local_180._M_string_length;
  local_60.piece_._M_str = local_180._M_dataplus._M_p;
  local_90.piece_._M_len = 0x21;
  local_90.piece_._M_str = "): string form of default value \'";
  StrCat<std::__cxx11::string,char[30],std::__cxx11::string>
            (&local_140,(lts_20240722 *)&local_120,&local_c0,&local_f0,&local_60,&local_90,
             (AlphaNum *)&v,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             "\' could not be parsed; error=",(char (*) [30])&error,args_2);
  (*raw_log_internal::internal_log_function_abi_cxx11_)
            (3,
             "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_abseil/build_O3/_deps/absl-src/absl/flags/internal/flag.cc"
             ,0x2ad,&local_140);
  std::__cxx11::string::~string((string *)&local_140);
  std::__cxx11::string::~string((string *)&local_180);
  __assert_fail("false && \"ABSL_UNREACHABLE reached\"",
                "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_abseil/build_O3/_deps/absl-src/absl/flags/internal/flag.cc"
                ,0x2ad,
                "virtual void absl::flags_internal::FlagImpl::CheckDefaultValueParsingRoundtrip() const"
               );
}

Assistant:

void FlagImpl::CheckDefaultValueParsingRoundtrip() const {
  std::string v = DefaultValue();

  absl::MutexLock lock(DataGuard());

  auto dst = MakeInitValue();
  std::string error;
  if (!flags_internal::Parse(op_, v, dst.get(), &error)) {
    ABSL_INTERNAL_LOG(
        FATAL,
        absl::StrCat("Flag ", Name(), " (from ", Filename(),
                     "): string form of default value '", v,
                     "' could not be parsed; error=", error));
  }

  // We do not compare dst to def since parsing/unparsing may make
  // small changes, e.g., precision loss for floating point types.
}